

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::ParamDict(ParamDict *this)

{
  undefined4 *in_RDI;
  undefined4 *local_20;
  ParamDict *in_stack_fffffffffffffff0;
  
  local_20 = in_RDI + 4;
  do {
    {unnamed_type#1}::ParamDict((anon_struct_64_3_9ed89b7b *)0x15e9cf);
    local_20 = local_20 + 0x10;
  } while (local_20 != in_RDI + 0x144);
  *in_RDI = 1;
  in_RDI[1] = 1;
  in_RDI[2] = 1;
  clear(in_stack_fffffffffffffff0);
  return;
}

Assistant:

ParamDict::ParamDict()
{
    use_winograd_convolution = 1;
    use_sgemm_convolution = 1;
    use_int8_inference = 1;

    clear();
}